

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

void obx::internal::throwIllegalArgumentException(char *text1,char *text2)

{
  IllegalArgumentException *this;
  allocator local_39;
  string local_38 [8];
  string msg;
  char *text2_local;
  char *text1_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,text1,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (text2 != (char *)0x0) {
    std::__cxx11::string::append((char *)local_38);
  }
  this = (IllegalArgumentException *)__cxa_allocate_exception(0x10);
  IllegalArgumentException::runtime_error(this,(string *)local_38);
  __cxa_throw(this,&IllegalArgumentException::typeinfo,
              IllegalArgumentException::~IllegalArgumentException);
}

Assistant:

[[noreturn]] void throwIllegalArgumentException(const char* text1, const char* text2) {
    std::string msg(text1);
    if (text2) msg.append(text2);
    throw IllegalArgumentException(msg);
}